

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::getVector(FastText *this,Vector *vec,string *word)

{
  bool bVar1;
  size_type sVar2;
  Matrix *in_RSI;
  undefined1 auVar3 [16];
  undefined1 in_ZMM0 [64];
  const_iterator it;
  string *in_stack_00000040;
  Dictionary *in_stack_00000048;
  vector<int,_std::allocator<int>_> *ngrams;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff78;
  __shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffff80;
  Matrix *A;
  element_type *in_stack_ffffffffffffff90;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_50 [3];
  vector<int,_std::allocator<int>_> local_38;
  vector<int,_std::allocator<int>_> *local_20;
  Matrix *local_10;
  
  local_10 = in_RSI;
  std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x13731f);
  Dictionary::getNgrams(in_stack_00000048,in_stack_00000040);
  local_20 = &local_38;
  Vector::zero((Vector *)local_10);
  local_50[0]._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff78);
  while( true ) {
    std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff78);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffff80,
                       (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffff78);
    auVar3 = in_ZMM0._0_16_;
    if (!bVar1) break;
    A = local_10;
    in_stack_ffffffffffffff90 =
         std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator*(in_stack_ffffffffffffff80);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
              (local_50);
    Vector::addRow((Vector *)in_stack_ffffffffffffff90,A,(int64_t)in_stack_ffffffffffffff80);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (local_50);
  }
  sVar2 = std::vector<int,_std::allocator<int>_>::size(local_20);
  if (sVar2 != 0) {
    sVar2 = std::vector<int,_std::allocator<int>_>::size(local_20);
    auVar3 = vcvtusi2sd_avx512f(auVar3,sVar2);
    Vector::mul((Vector *)local_10,(float)(1.0 / auVar3._0_8_));
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff90);
  return;
}

Assistant:

void FastText::getVector(Vector& vec, const std::string& word) {
  const std::vector<int32_t>& ngrams = dict_->getNgrams(word);
  vec.zero();
  for (auto it = ngrams.begin(); it != ngrams.end(); ++it) {
	vec.addRow(*input_, *it);
  }
  if (ngrams.size() > 0) {
    vec.mul(1.0 / ngrams.size());
  }
}